

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestMutualRecursionA::_InternalSerialize
          (TestMutualRecursionA *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  TestMutualRecursionB *value;
  ulong uVar2;
  anon_union_48_1_493b367e_for_TestMutualRecursionA_3 aVar3;
  uint8_t *puVar4;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestMutualRecursionA_SubGroupR>_>
  *value_00;
  int index;
  
  aVar3 = this->field_0;
  if (((undefined1  [48])aVar3 & (undefined1  [48])0x1) != (undefined1  [48])0x0) {
    value = (this->field_0)._impl_.bb_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  if (((undefined1  [48])aVar3 & (undefined1  [48])0x2) != (undefined1  [48])0x0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                       (2,(MessageLite *)(this->field_0)._impl_.subgroup_,puVar4,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (index = 0; iVar1 != index; index = index + 1) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestMutualRecursionA_SubGroupR>>
                         (&(this->field_0)._impl_.subgroupr_.super_RepeatedPtrFieldBase,index);
    target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                       (5,(MessageLite *)value_00,puVar4,stream);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMutualRecursionA::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMutualRecursionA& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestMutualRecursionA)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestMutualRecursionB bb = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.bb_, this_._impl_.bb_->GetCachedSize(), target,
        stream);
  }

  // .proto2_unittest.TestMutualRecursionA.SubGroup subgroup = 2 [features = {
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        2, *this_._impl_.subgroup_, target, stream);
  }

  // repeated .proto2_unittest.TestMutualRecursionA.SubGroupR subgroupr = 5 [features = {
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_subgroupr_size());
       i < n; i++) {
    target = stream->EnsureSpace(target);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
            5, this_._internal_subgroupr().Get(i),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestMutualRecursionA)
  return target;
}